

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

ZoneState * __thiscall
QTimeZonePrivate::stateAtZoneTime
          (ZoneState *__return_storage_ptr__,QTimeZonePrivate *this,qint64 forLocalMSecs,
          TransitionOptions resolve)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  DaylightStatus DVar7;
  uint uVar8;
  qint64 qVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long in_FS_OFFSET;
  Data newTran;
  Data nextTran;
  Data data;
  Data future;
  Data past;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar12 = forLocalMSecs + -61200000;
  if (SCARRY8(forLocalMSecs,-61200000)) {
    lVar12 = -0x7fffffffffffffff;
  }
  if (forLocalMSecs == -0x7ffffffffc5a2980) {
    lVar12 = -0x7fffffffffffffff;
  }
  lVar13 = forLocalMSecs + 61200000;
  if (SCARRY8(forLocalMSecs,61200000)) {
    lVar13 = 0x7fffffffffffffff;
  }
  past.offsetFromUtc = -0x55555556;
  past.standardTimeOffset = -0x55555556;
  past.daylightTimeOffset = -0x55555556;
  past._44_4_ = 0xaaaaaaaa;
  past.abbreviation.d.size._0_4_ = 0xaaaaaaaa;
  past.abbreviation.d.size._4_4_ = 0xaaaaaaaa;
  past.atMSecsSinceEpoch._0_4_ = 0xaaaaaaaa;
  past.atMSecsSinceEpoch._4_4_ = 0xaaaaaaaa;
  past.abbreviation.d.d._0_4_ = 0xaaaaaaaa;
  past.abbreviation.d.d._4_4_ = 0xaaaaaaaa;
  past.abbreviation.d.ptr._0_4_ = 0xaaaaaaaa;
  past.abbreviation.d.ptr._4_4_ = 0xaaaaaaaa;
  (*this->_vptr_QTimeZonePrivate[0xd])(&past,this,lVar12);
  future.offsetFromUtc = -0x55555556;
  future.standardTimeOffset = -0x55555556;
  future.daylightTimeOffset = -0x55555556;
  future._44_4_ = 0xaaaaaaaa;
  future.abbreviation.d.size._0_4_ = 0xaaaaaaaa;
  future.abbreviation.d.size._4_4_ = 0xaaaaaaaa;
  future.atMSecsSinceEpoch._0_4_ = 0xaaaaaaaa;
  future.atMSecsSinceEpoch._4_4_ = 0xaaaaaaaa;
  future.abbreviation.d.d._0_4_ = 0xaaaaaaaa;
  future.abbreviation.d.d._4_4_ = 0xaaaaaaaa;
  future.abbreviation.d.ptr._0_4_ = 0xaaaaaaaa;
  future.abbreviation.d.ptr._4_4_ = 0xaaaaaaaa;
  (*this->_vptr_QTimeZonePrivate[0xd])(&future,this,lVar13);
  if ((CONCAT44(future.atMSecsSinceEpoch._4_4_,(undefined4)future.atMSecsSinceEpoch) ==
       -0x8000000000000000) &&
     (CONCAT44(past.atMSecsSinceEpoch._4_4_,(undefined4)past.atMSecsSinceEpoch) ==
      -0x8000000000000000)) {
LAB_003ab19e:
    __return_storage_ptr__->when = forLocalMSecs;
    __return_storage_ptr__->offset = 0;
    __return_storage_ptr__->dst = UnknownDaylightTime;
    __return_storage_ptr__->valid = false;
  }
  else {
    if ((past.offsetFromUtc == future.offsetFromUtc) &&
       ((past.standardTimeOffset == future.standardTimeOffset &&
        (bVar3 = ::comparesEqual(&past.abbreviation,&future.abbreviation), bVar3)))) {
      data._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      data._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      data.abbreviation.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      data.atMSecsSinceEpoch = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      data.abbreviation.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      data.abbreviation.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      Data::Data(&data,&future);
      data.atMSecsSinceEpoch = forLocalMSecs + (long)future.offsetFromUtc * -1000;
      __return_storage_ptr__->when = (long)data.offsetFromUtc * 1000 + data.atMSecsSinceEpoch;
      __return_storage_ptr__->offset = data.offsetFromUtc;
      __return_storage_ptr__->dst = (uint)(data.daylightTimeOffset != 0);
      __return_storage_ptr__->valid = true;
    }
    else {
      iVar4 = (*this->_vptr_QTimeZonePrivate[0x10])(this);
      if ((char)iVar4 != '\0') {
        data._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        data._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        data.abbreviation.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        data.atMSecsSinceEpoch = (qint64)&DAT_aaaaaaaaaaaaaaaa;
        data.abbreviation.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        data.abbreviation.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        Data::Data(&data,&past);
        nextTran.offsetFromUtc = -0x55555556;
        nextTran.standardTimeOffset = -0x55555556;
        nextTran.daylightTimeOffset = -0x55555556;
        nextTran._44_4_ = 0xaaaaaaaa;
        nextTran.abbreviation.d.size._0_4_ = 0xaaaaaaaa;
        nextTran.abbreviation.d.size._4_4_ = 0xaaaaaaaa;
        nextTran.atMSecsSinceEpoch = (qint64)&DAT_aaaaaaaaaaaaaaaa;
        nextTran.abbreviation.d.d._0_4_ = 0xaaaaaaaa;
        nextTran.abbreviation.d.d._4_4_ = 0xaaaaaaaa;
        nextTran.abbreviation.d.ptr._0_4_ = 0xaaaaaaaa;
        nextTran.abbreviation.d.ptr._4_4_ = 0xaaaaaaaa;
        (*this->_vptr_QTimeZonePrivate[0x11])(&nextTran,this,data.atMSecsSinceEpoch);
        while (nextTran.atMSecsSinceEpoch != -0x8000000000000000) {
          qVar9 = nextTran.atMSecsSinceEpoch;
          if (forLocalMSecs <= (long)nextTran.offsetFromUtc * 1000 + nextTran.atMSecsSinceEpoch)
          goto LAB_003ab3cc;
          newTran.offsetFromUtc = -0x55555556;
          newTran.standardTimeOffset = -0x55555556;
          newTran.daylightTimeOffset = -0x55555556;
          newTran._44_4_ = 0xaaaaaaaa;
          newTran.abbreviation.d.size._0_4_ = 0xaaaaaaaa;
          newTran.abbreviation.d.size._4_4_ = 0xaaaaaaaa;
          newTran.atMSecsSinceEpoch._0_4_ = 0xaaaaaaaa;
          newTran.atMSecsSinceEpoch._4_4_ = 0xaaaaaaaa;
          newTran.abbreviation.d.d._0_4_ = 0xaaaaaaaa;
          newTran.abbreviation.d.d._4_4_ = 0xaaaaaaaa;
          newTran.abbreviation.d.ptr._0_4_ = 0xaaaaaaaa;
          newTran.abbreviation.d.ptr._4_4_ = 0xaaaaaaaa;
          (*this->_vptr_QTimeZonePrivate[0x11])(&newTran,this);
          if ((CONCAT44(newTran.atMSecsSinceEpoch._4_4_,(undefined4)newTran.atMSecsSinceEpoch) ==
               -0x8000000000000000) ||
             (lVar13 < CONCAT44(newTran.atMSecsSinceEpoch._4_4_,
                                (undefined4)newTran.atMSecsSinceEpoch) +
                       (long)newTran.offsetFromUtc * 1000)) {
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&newTran)
            ;
            qVar9 = nextTran.atMSecsSinceEpoch;
            goto LAB_003ab3cc;
          }
          Data::operator=(&data,&nextTran);
          Data::operator=(&nextTran,&newTran);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&newTran);
        }
        qVar9 = -0x8000000000000000;
LAB_003ab3cc:
        if (data.atMSecsSinceEpoch != -0x8000000000000000) {
          data.atMSecsSinceEpoch = forLocalMSecs + (long)data.offsetFromUtc * -1000;
          iVar4 = data.offsetFromUtc;
          if (qVar9 == -0x8000000000000000) {
            if (data.offsetFromUtc == future.offsetFromUtc) goto LAB_003ab4cf;
          }
          else if (data.atMSecsSinceEpoch != -0x8000000000000000) {
            lVar12 = forLocalMSecs + (long)nextTran.offsetFromUtc * -1000;
            nextTran.atMSecsSinceEpoch = lVar12;
            if (lVar12 < qVar9) {
              if (data.atMSecsSinceEpoch < qVar9) {
LAB_003ab4cf:
                DVar7 = (DaylightStatus)(data.daylightTimeOffset != 0);
                bVar3 = true;
              }
              else {
                if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                           super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i >> 10 & 1) == 0
                   ) {
                  uVar8 = 0xfffffffb;
                  uVar11 = 0xfffffffd;
                }
                else {
                  uVar8 = (uint)(nextTran.daylightTimeOffset == 0 && data.daylightTimeOffset != 0) *
                          2 - 5;
                  uVar11 = (uint)(nextTran.daylightTimeOffset != 0 || data.daylightTimeOffset == 0)
                           * 2 - 5;
                }
                nextTran.atMSecsSinceEpoch = data.atMSecsSinceEpoch;
                if ((uVar8 | (uint)resolve.
                                   super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                                   super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i) ==
                    0xffffffff) {
                  forLocalMSecs = data.atMSecsSinceEpoch + (long)nextTran.offsetFromUtc * 1000;
                  data.atMSecsSinceEpoch = lVar12;
                  goto LAB_003ab6a0;
                }
                if ((uVar11 | (uint)resolve.
                                    super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>
                                    .super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i) ==
                    0xffffffff) {
                  forLocalMSecs = lVar12 + (long)data.offsetFromUtc * 1000;
                  DVar7 = (DaylightStatus)(data.daylightTimeOffset != 0);
                  bVar3 = true;
                  data.atMSecsSinceEpoch = lVar12;
                }
                else {
LAB_003ab675:
                  data.atMSecsSinceEpoch = lVar12;
                  DVar7 = UnknownDaylightTime;
                  iVar4 = 0;
                  bVar3 = false;
                }
              }
            }
            else {
              if (data.atMSecsSinceEpoch < qVar9) {
                if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                           super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i >> 10 & 1) == 0
                   ) {
                  uVar8 = 0xffffffbf;
                  uVar11 = 0xffffffdf;
                }
                else {
                  uVar8 = (uint)(nextTran.daylightTimeOffset != 0 && data.daylightTimeOffset == 0) *
                          0x20 - 0x41;
                  uVar11 = (uint)(nextTran.daylightTimeOffset == 0 || data.daylightTimeOffset != 0)
                           * 0x20 - 0x41;
                }
                if ((uVar8 | (uint)resolve.
                                   super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                                   super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i) !=
                    0xffffffff) {
                  lVar12 = data.atMSecsSinceEpoch;
                  if ((uVar11 | (uint)resolve.
                                      super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>
                                      .super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i) !=
                      0xffffffff) goto LAB_003ab675;
                  goto LAB_003ab4cf;
                }
              }
LAB_003ab6a0:
              DVar7 = (DaylightStatus)(nextTran.daylightTimeOffset != 0);
              bVar3 = true;
              iVar4 = nextTran.offsetFromUtc;
            }
            __return_storage_ptr__->when = forLocalMSecs;
            __return_storage_ptr__->offset = iVar4;
            __return_storage_ptr__->dst = DVar7;
            __return_storage_ptr__->valid = bVar3;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&nextTran);
            goto LAB_003ab268;
          }
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&nextTran);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&data);
      }
      iVar2 = past.offsetFromUtc;
      iVar4 = future.offsetFromUtc;
      lVar13 = (long)past.offsetFromUtc;
      lVar12 = (long)future.offsetFromUtc;
      if (future.offsetFromUtc == past.offsetFromUtc) {
        lVar10 = forLocalMSecs + lVar13 * -1000;
        if (SBORROW8(forLocalMSecs,lVar13 * 1000)) goto LAB_003ab19e;
      }
      else {
        lVar13 = forLocalMSecs + lVar13 * -1000;
        iVar5 = (*this->_vptr_QTimeZonePrivate[8])(this);
        lVar12 = forLocalMSecs + lVar12 * -1000;
        iVar6 = (*this->_vptr_QTimeZonePrivate[8])(this);
        if (iVar5 == iVar2) {
          lVar10 = lVar13;
          if ((((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                      super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 0x20) == 0 &&
               iVar6 == iVar4) &&
             (lVar10 = lVar12,
             ((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                    super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 0x40) == 0))
          goto LAB_003ab19e;
        }
        else {
          lVar10 = lVar12;
          if (iVar6 != iVar4) {
            iVar4 = (iVar4 - iVar2) * 1000;
            if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                       super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 2) == 0) {
              if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                         super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 4) == 0)
              goto LAB_003ab19e;
              lVar10 = lVar12 + iVar4;
            }
            else {
              lVar10 = lVar13 - iVar4;
            }
          }
        }
      }
      (*this->_vptr_QTimeZonePrivate[0xd])(&data,this,lVar10);
      __return_storage_ptr__->when = (long)data.offsetFromUtc * 1000 + data.atMSecsSinceEpoch;
      __return_storage_ptr__->offset = data.offsetFromUtc;
      __return_storage_ptr__->dst = (uint)(data.daylightTimeOffset != 0);
      __return_storage_ptr__->valid = true;
    }
LAB_003ab268:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&data);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&future);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&past);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimePrivate::ZoneState QTimeZonePrivate::stateAtZoneTime(
    qint64 forLocalMSecs, QDateTimePrivate::TransitionOptions resolve) const
{
    auto dataToState = [](const Data &d) {
        return QDateTimePrivate::ZoneState(d.atMSecsSinceEpoch + d.offsetFromUtc * 1000,
                                           d.offsetFromUtc,
                                           d.daylightTimeOffset ? QDateTimePrivate::DaylightTime
                                                                : QDateTimePrivate::StandardTime);
    };

    /*
      We need a UTC time at which to ask for the offset, in order to be able to
      add that offset to forLocalMSecs, to get the UTC time we need.
      Fortunately, all time-zone offsets have been less than 17 hours; and DST
      transitions happen (much) more than thirty-four hours apart. So sampling
      offset seventeen hours each side gives us information we can be sure
      brackets the correct time and at most one DST transition.
    */
    std::integral_constant<qint64, 17 * 3600 * 1000> seventeenHoursInMSecs;
    static_assert(-seventeenHoursInMSecs / 1000 < QTimeZone::MinUtcOffsetSecs
                  && seventeenHoursInMSecs / 1000 > QTimeZone::MaxUtcOffsetSecs);
    qint64 millis;
    // Clip the bracketing times to the bounds of the supported range.
    const qint64 recent =
        qSubOverflow(forLocalMSecs, seventeenHoursInMSecs, &millis) || millis < minMSecs()
        ? minMSecs() : millis; // Necessarily <= forLocalMSecs + 1.
    // (Given that minMSecs() is std::numeric_limits<qint64>::min() + 1.)
    const qint64 imminent =
        qAddOverflow(forLocalMSecs, seventeenHoursInMSecs, &millis)
        ? maxMSecs() : millis; // Necessarily >= forLocalMSecs
    // At most one of those was clipped to its boundary value:
    Q_ASSERT(recent < imminent && seventeenHoursInMSecs < imminent - recent + 1);

    const Data past = data(recent), future = data(imminent);
    if (future.atMSecsSinceEpoch == invalidMSecs()
        && past.atMSecsSinceEpoch == invalidMSecs()) {
        // Failed to get any useful data near this time: apparently out of range
        // for the backend.
        return { forLocalMSecs };
    }
    // > 99% of the time, past and future will agree:
    if (Q_LIKELY(past.offsetFromUtc == future.offsetFromUtc
                 && past.standardTimeOffset == future.standardTimeOffset
                 // Those two imply same daylightTimeOffset.
                 && past.abbreviation == future.abbreviation)) {
        Data data = future;
        data.atMSecsSinceEpoch = forLocalMSecs - future.offsetFromUtc * 1000;
        return dataToState(data);
    }

    /*
      Offsets are Local - UTC, positive to the east of Greenwich, negative to
      the west; DST offset normally exceeds standard offset, when DST applies.
      When we have offsets on either side of a transition, the lower one is
      standard, the higher is DST, unless we have data telling us it's the other
      way round.

      Non-DST transitions (jurisdictions changing time-zone and time-zones
      changing their standard offset, typically) are described below as if they
      were DST transitions (since these are more usual and familiar); the code
      mostly concerns itself with offsets from UTC, described in terms of the
      common case for changes in that.  If there is no actual change in offset
      (e.g. a DST transition cancelled by a standard offset change), this code
      should handle it gracefully; without transitions, it'll see early == late
      and take the easy path; with transitions, tran and nextTran get the
      correct UTC time as atMSecsSinceEpoch so comparing to nextStart selects
      the right one.  In all other cases, the transition changes offset and the
      reasoning that applies to DST applies just the same.

      The resolution of transitions, specified by \a resolve, may be lead astray
      if (as happens on Windows) the backend has been obliged to guess whether a
      transition is in fact a DST one or a change to standard offset; or to
      guess that the higher-offset side is the DST one (the reverse of this is
      true for Ireland, using negative DST). There's not much we can do about
      that, though.
    */
    if (hasTransitions()) {
        /*
          We have transitions.

          Each transition gives the offsets to use until the next; so we need
          the most recent transition before the time forLocalMSecs describes. If
          it describes a time *in* a transition, we'll need both that transition
          and the one before it. So find one transition that's probably after
          (and not much before, otherwise) and another that's definitely before,
          then work out which one to use. When both or neither work on
          forLocalMSecs, use resolve to disambiguate.
        */

        // Get a transition definitely before the local MSecs; usually all we need.
        // Only around the transition times might we need another.
        Data tran = past; // Data after last transition before our window.
        Q_ASSERT(forLocalMSecs < 0 || // Pre-epoch TZ info may be unavailable
                 forLocalMSecs - tran.offsetFromUtc * 1000 >= tran.atMSecsSinceEpoch);
        // If offset actually exceeds 17 hours, that assert may trigger.
        Data nextTran = nextTransition(tran.atMSecsSinceEpoch);
        /*
          Now walk those forward until they bracket forLocalMSecs with transitions.

          One of the transitions should then be telling us the right offset to use.
          In a transition, we need the transition before it (to describe the run-up
          to the transition) and the transition itself; so we need to stop when
          nextTran is (invalid or) that transition.
        */
        while (nextTran.atMSecsSinceEpoch != invalidMSecs()
               && forLocalMSecs > nextTran.atMSecsSinceEpoch + nextTran.offsetFromUtc * 1000) {
            Data newTran = nextTransition(nextTran.atMSecsSinceEpoch);
            if (newTran.atMSecsSinceEpoch == invalidMSecs()
                || newTran.atMSecsSinceEpoch + newTran.offsetFromUtc * 1000 > imminent) {
                // Definitely not a relevant tansition: too far in the future.
                break;
            }
            tran = nextTran;
            nextTran = newTran;
        }
        const qint64 nextStart = nextTran.atMSecsSinceEpoch;

        // Check we do *really* have transitions for this zone:
        if (tran.atMSecsSinceEpoch != invalidMSecs()) {
            /* So now tran is definitely before ... */
            Q_ASSERT(forLocalMSecs < 0
                     || forLocalMSecs - tran.offsetFromUtc * 1000 > tran.atMSecsSinceEpoch);
            // Work out the UTC value it would make sense to return if using tran:
            tran.atMSecsSinceEpoch = forLocalMSecs - tran.offsetFromUtc * 1000;

            // If there are no transition after it, the answer is easy - or
            // should be - but Darwin's handling of the distant future (in macOS
            // 15, QTBUG-126391) runs out of transitions in 506'712 CE, despite
            // knowing about offset changes long after that. So only trust the
            // easy answer if offsets match; otherwise, fall through to the
            // transitions-unknown code.
            if (nextStart == invalidMSecs() && tran.offsetFromUtc == future.offsetFromUtc)
                return dataToState(tran); // Last valid transition.
        }

        if (tran.atMSecsSinceEpoch != invalidMSecs() && nextStart != invalidMSecs()) {
            /*
              ... and nextTran is either after or only slightly before. We're
              going to interpret one as standard time, the other as DST
              (although the transition might in fact be a change in standard
              offset, or a change in DST offset, e.g. to/from double-DST).

              Usually exactly one of those shall be relevant and we'll use it;
              but if we're close to nextTran we may be in a transition, to be
              settled according to resolve's rules.
            */
            // Work out the UTC value it would make sense to return if using nextTran:
            nextTran.atMSecsSinceEpoch = forLocalMSecs - nextTran.offsetFromUtc * 1000;

            bool fallBack = false;
            if (nextStart > nextTran.atMSecsSinceEpoch) {
                // If both UTC values are before nextTran's offset applies, use tran:
                if (nextStart > tran.atMSecsSinceEpoch)
                    return dataToState(tran);

                Q_ASSERT(tran.offsetFromUtc < nextTran.offsetFromUtc);
                // We're in a spring-forward.
            } else if (nextStart <= tran.atMSecsSinceEpoch) {
                // Both UTC values say we should be using nextTran:
                return dataToState(nextTran);
            } else {
                Q_ASSERT(nextTran.offsetFromUtc < tran.offsetFromUtc);
                fallBack = true; // We're in a fall-back.
            }
            // (forLocalMSecs - nextStart) / 1000 lies between the two offsets.

            // Apply resolve:
            // Determine whether FlipForReverseDst affects the outcome:
            const bool flipped
                = resolve.testFlag(QDateTimePrivate::FlipForReverseDst)
                && (fallBack ? !tran.daylightTimeOffset && nextTran.daylightTimeOffset
                             : tran.daylightTimeOffset && !nextTran.daylightTimeOffset);

            if (fallBack) {
                if (resolve.testFlag(flipped
                                     ? QDateTimePrivate::FoldUseBefore
                                     : QDateTimePrivate::FoldUseAfter)) {
                    return dataToState(nextTran);
                }
                if (resolve.testFlag(flipped
                                     ? QDateTimePrivate::FoldUseAfter
                                     : QDateTimePrivate::FoldUseBefore)) {
                    return dataToState(tran);
                }
            } else {
                /* Neither is valid (e.g. in a spring-forward's gap) and
                   nextTran.atMSecsSinceEpoch < nextStart <= tran.atMSecsSinceEpoch.
                   So swap their atMSecsSinceEpoch to give each a moment on the
                   side of the transition that it describes, then select the one
                   after or before according to the option set:
                */
                std::swap(tran.atMSecsSinceEpoch, nextTran.atMSecsSinceEpoch);
                if (resolve.testFlag(flipped
                                     ? QDateTimePrivate::GapUseBefore
                                     : QDateTimePrivate::GapUseAfter))
                    return dataToState(nextTran);
                if (resolve.testFlag(flipped
                                     ? QDateTimePrivate::GapUseAfter
                                     : QDateTimePrivate::GapUseBefore))
                    return dataToState(tran);
            }
            // Reject
            return {forLocalMSecs};
        }
        // Before first transition, or system has transitions but not for this zone.
        // Try falling back to offsetFromUtc (works for before first transition, at least).
    }

    /* Bracket and refine to discover offset. */
    qint64 utcEpochMSecs;

    // We don't have true data on DST-ness, so can't apply FlipForReverseDst.
    int early = past.offsetFromUtc;
    int late = future.offsetFromUtc;
    if (early == late || late == invalidSeconds()) {
        if (early == invalidSeconds()
            || qSubOverflow(forLocalMSecs, early * qint64(1000), &utcEpochMSecs)) {
            return {forLocalMSecs}; // Outside representable range
        }
    } else {
        // Candidate values for utcEpochMSecs (if forLocalMSecs is valid):
        const qint64 forEarly = forLocalMSecs - early * 1000;
        const qint64 forLate = forLocalMSecs - late * 1000;
        // If either of those doesn't have the offset we got it from, it's on
        // the wrong side of the transition (and both may be, for a gap):
        const bool earlyOk = offsetFromUtc(forEarly) == early;
        const bool lateOk = offsetFromUtc(forLate) == late;

        if (earlyOk) {
            if (lateOk) {
                Q_ASSERT(early > late);
                // fall-back's repeated interval
                if (resolve.testFlag(QDateTimePrivate::FoldUseBefore))
                    utcEpochMSecs = forEarly;
                else if (resolve.testFlag(QDateTimePrivate::FoldUseAfter))
                    utcEpochMSecs = forLate;
                else
                    return {forLocalMSecs};
            } else {
                // Before and clear of the transition:
                utcEpochMSecs = forEarly;
            }
        } else if (lateOk) {
            // After and clear of the transition:
            utcEpochMSecs = forLate;
        } else {
            // forLate <= gap < forEarly
            Q_ASSERT(late > early);
            const int dstStep = (late - early) * 1000;
            if (resolve.testFlag(QDateTimePrivate::GapUseBefore))
                utcEpochMSecs = forEarly - dstStep;
            else if (resolve.testFlag(QDateTimePrivate::GapUseAfter))
                utcEpochMSecs = forLate + dstStep;
            else
                return {forLocalMSecs};
        }
    }

    return dataToState(data(utcEpochMSecs));
}